

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O1

void helper_mttc0_tchalt_mipsel(CPUMIPSState_conflict2 *env,target_ulong_conflict arg1)

{
  CPUState *cpu_00;
  TCState *pTVar1;
  target_ulong_conflict tVar2;
  CPUState *cpu;
  uint32_t uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  
  if ((env->CP0_VPEConf0 & 2) == 0) {
    uVar3 = env->current_tc;
  }
  else {
    uVar3 = (uint32_t)
            ((long)(ulong)(byte)env->CP0_VPEControl %
            (long)*(int *)((long)env[-4].tcs[0xd].mmr + 0x2c));
  }
  cpu_00 = (CPUState *)(env[-4].tcs[0xd].mmr + 5);
  pTVar1 = env->tcs + (int)uVar3;
  if (uVar3 == env->current_tc) {
    pTVar1 = &env->active_tc;
  }
  pTVar1->CP0_TCHalt = arg1;
  bVar5 = (env->CP0_VPEConf0 & 1U) == 0;
  bVar4 = ((uint)(env->active_tc).CP0_TCStatus >> 0xd & 1) == 0;
  bVar6 = (env->mvp->CP0_MVPControl & 1U) == 0;
  tVar2 = (env->active_tc).CP0_TCHalt;
  if ((arg1 & 1) == 0) {
    if ((((!bVar4 && !bVar5) && (tVar2 & 1) == 0) && !bVar6) && (env[-1].tcs[0xc].gpr[4] == 0)) {
      (*cpu_interrupt_handler)(cpu_00,0x100);
      return;
    }
  }
  else if (((bVar4 || bVar5) || (tVar2 & 1) != 0) || bVar6) {
    env[-1].tcs[0xc].gpr[4] = 1;
    cpu_reset_interrupt(cpu_00,0x100);
    return;
  }
  return;
}

Assistant:

static CPUMIPSState *mips_cpu_map_tc(CPUMIPSState *env, int *tc)
{
    CPUState *cs;
    // int vpe_idx;
    int tc_idx = *tc;

    if (!(env->CP0_VPEConf0 & (1 << CP0VPEC0_MVP))) {
        /* Not allowed to address other CPUs.  */
        *tc = env->current_tc;
        return env;
    }

    cs = env_cpu(env);
    // vpe_idx = tc_idx / cs->nr_threads;
    *tc = tc_idx % cs->nr_threads;
    return env;

#if 0
    MIPSCPU *cpu;
    CPUState *other_cs;
    other_cs = qemu_get_cpu(vpe_idx);
    if (other_cs == NULL) {
        return env;
    }
    cpu = MIPS_CPU(other_cs);
    return &cpu->env;
#endif
}